

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O1

void __thiscall
TPZDohrAssembly<double>::Extract
          (TPZDohrAssembly<double> *this,int isub,TPZFMatrix<double> *global,
          TPZFMatrix<double> *local)

{
  TPZVec<int> *pTVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 extraout_XMM0_Qa;
  
  pTVar1 = (this->fFineEqs).fStore;
  uVar2 = pTVar1[isub].fNElements;
  uVar3 = (global->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  iVar4 = (int)uVar2;
  iVar5 = (int)uVar3;
  (*(local->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (local,(long)iVar4,(long)iVar5);
  if (0 < iVar5) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (0 < iVar4) {
        uVar8 = 0;
        do {
          (*(global->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(global,(long)pTVar1[isub].fStore[uVar8],uVar6);
          if (((local->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar8) ||
             ((local->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined8 *)
           ((long)local->fElem +
           uVar8 * 8 + (local->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar7) =
               extraout_XMM0_Qa;
          uVar8 = uVar8 + 1;
        } while ((uVar2 & 0x7fffffff) != uVar8);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 != (uVar3 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Extract(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = global.Cols();
	int ieq;
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "sub structure " << isub << " Extracting destination indices " << avec << std::endl;
		local.Print("extracted vector",sout);
		global.Print("Global vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}